

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

uint aom_highbd_avg_8x8_c(uint8_t *s8,int p)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  lVar8 = (long)s8 * 2;
  iVar9 = 0;
  iVar7 = 0;
  do {
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    lVar6 = 0;
    do {
      uVar1 = *(ulong *)(lVar8 + lVar6 * 2);
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar1;
      auVar2._12_2_ = (short)(uVar1 >> 0x30);
      auVar3._8_2_ = (short)(uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._10_4_ = auVar2._10_4_;
      auVar5._6_8_ = 0;
      auVar5._0_6_ = auVar3._8_6_;
      auVar4._4_2_ = (short)(uVar1 >> 0x10);
      auVar4._0_4_ = (uint)uVar1;
      auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
      iVar9 = iVar9 + ((uint)uVar1 & 0xffff);
      iVar10 = iVar10 + auVar4._4_4_;
      iVar11 = iVar11 + auVar3._8_4_;
      iVar12 = iVar12 + (auVar2._10_4_ >> 0x10);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 8);
    iVar9 = iVar12 + iVar10 + iVar11 + iVar9;
    iVar7 = iVar7 + 1;
    lVar8 = lVar8 + (long)p * 2;
  } while (iVar7 != 8);
  return iVar9 + 0x20 >> 6;
}

Assistant:

unsigned int aom_highbd_avg_8x8_c(const uint8_t *s8, int p) {
  int i, j;
  int sum = 0;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  for (i = 0; i < 8; ++i, s += p)
    for (j = 0; j < 8; sum += s[j], ++j) {
    }

  return (sum + 32) >> 6;
}